

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_function_createClosureWithCaptureVectorArray
          (sysbvm_context_t *context,sysbvm_tuple_t functionDefinition,
          sysbvm_tuple_t captureVectorArray)

{
  sysbvm_error("TODO: Implement this method.");
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_function_createClosureWithCaptureVectorArray(sysbvm_context_t *context, sysbvm_tuple_t functionDefinition, sysbvm_tuple_t captureVectorArray)
{
    (void)context;
    (void)functionDefinition;
    (void)captureVectorArray;
    sysbvm_error("TODO: Implement this method.");
    return SYSBVM_NULL_TUPLE;
    //return sysbvm_function_createClosureWithCaptureVector(context, functionDefinition, captureVectorArray);
}